

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkMutableDescriptorTypeCreateInfoEXT *create_info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  GenericStringRef<char> local_88;
  uint local_74;
  VkMutableDescriptorTypeListEXT *pVStack_70;
  uint32_t j;
  VkMutableDescriptorTypeListEXT *l;
  Value list;
  undefined1 local_50 [4];
  uint32_t i;
  Value lists;
  undefined1 local_30 [8];
  Value value;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkMutableDescriptorTypeCreateInfoEXT *create_info_local;
  
  value.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_30,kObjectType);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>
            ((GenericStringRef<char> *)((long)&lists.data_ + 8),(char (*) [6])"sType");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkStructureType>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_30,(StringRefType *)((long)&lists.data_ + 8),create_info->sType,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_50,kArrayType);
  for (list.data_._12_4_ = 0; (uint)list.data_._12_4_ < create_info->mutableDescriptorTypeListCount;
      list.data_._12_4_ = list.data_._12_4_ + 1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&l,kArrayType);
    pVStack_70 = create_info->pMutableDescriptorTypeLists + (uint)list.data_._12_4_;
    for (local_74 = 0; local_74 < pVStack_70->descriptorTypeCount; local_74 = local_74 + 1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack<VkDescriptorType>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&l,pVStack_70->pDescriptorTypes[local_74],alloc);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_50,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&l,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&l);
  }
  rapidjson::GenericStringRef<char>::GenericStringRef<27u>
            (&local_88,(char (*) [27])"mutableDescriptorTypeLists");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_30,&local_88,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_50,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(value.data_.a.elements,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_50);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_30);
  return true;
}

Assistant:

static bool json_value(const VkMutableDescriptorTypeCreateInfoEXT &create_info, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("sType", create_info.sType, alloc);

	Value lists(kArrayType);
	for (uint32_t i = 0; i < create_info.mutableDescriptorTypeListCount; i++)
	{
		Value list(kArrayType);
		auto &l = create_info.pMutableDescriptorTypeLists[i];
		for (uint32_t j = 0; j < l.descriptorTypeCount; j++)
			list.PushBack(l.pDescriptorTypes[j], alloc);
		lists.PushBack(list, alloc);
	}
	value.AddMember("mutableDescriptorTypeLists", lists, alloc);

	*out_value = value;
	return true;
}